

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::javanano::RepeatedMessageFieldGenerator::GenerateMergingCode
          (RepeatedMessageFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  Type TVar1;
  char *pcVar2;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "int arrayLength = com.google.protobuf.nano.WireFormatNano\n    .getRepeatedFieldArrayLength(input, $tag$);\nint i = this.$name$ == null ? 0 : this.$name$.length;\n$type$[] newArray =\n    new $type$[i + arrayLength];\nif (i != 0) {\n  java.lang.System.arraycopy(this.$name$, 0, newArray, 0, i);\n}\nfor (; i < newArray.length - 1; i++) {\n  newArray[i] = new $type$();\n"
                    );
  TVar1 = FieldDescriptor::type(this->descriptor_);
  pcVar2 = "  input.readMessage(newArray[i]);\n";
  if (TVar1 == TYPE_GROUP) {
    pcVar2 = "  input.readGroup(newArray[i], $number$);\n";
  }
  io::Printer::Print(printer,variables,pcVar2);
  io::Printer::Print(printer,variables,
                     "  input.readTag();\n}\n// Last one without readTag.\nnewArray[i] = new $type$();\n"
                    );
  TVar1 = FieldDescriptor::type(this->descriptor_);
  pcVar2 = "  input.readMessage(newArray[i]);\n";
  if (TVar1 == TYPE_GROUP) {
    pcVar2 = "  input.readGroup(newArray[i], $number$);\n";
  }
  io::Printer::Print(printer,variables,pcVar2 + 2);
  io::Printer::Print(printer,variables,"this.$name$ = newArray;\n");
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::
GenerateMergingCode(io::Printer* printer) const {
  // First, figure out the length of the array, then parse.
  printer->Print(variables_,
    "int arrayLength = com.google.protobuf.nano.WireFormatNano\n"
    "    .getRepeatedFieldArrayLength(input, $tag$);\n"
    "int i = this.$name$ == null ? 0 : this.$name$.length;\n"
    "$type$[] newArray =\n"
    "    new $type$[i + arrayLength];\n"
    "if (i != 0) {\n"
    "  java.lang.System.arraycopy(this.$name$, 0, newArray, 0, i);\n"
    "}\n"
    "for (; i < newArray.length - 1; i++) {\n"
    "  newArray[i] = new $type$();\n");

  if (descriptor_->type() == FieldDescriptor::TYPE_GROUP) {
    printer->Print(variables_,
      "  input.readGroup(newArray[i], $number$);\n");
  } else {
    printer->Print(variables_,
      "  input.readMessage(newArray[i]);\n");
  }

  printer->Print(variables_,
    "  input.readTag();\n"
    "}\n"
    "// Last one without readTag.\n"
    "newArray[i] = new $type$();\n");

  if (descriptor_->type() == FieldDescriptor::TYPE_GROUP) {
    printer->Print(variables_,
      "input.readGroup(newArray[i], $number$);\n");
  } else {
    printer->Print(variables_,
      "input.readMessage(newArray[i]);\n");
  }

  printer->Print(variables_,
    "this.$name$ = newArray;\n");
}